

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O2

void __thiscall
OpenMD::DataStorage::internalResize<OpenMD::SquareMatrix3<double>>
          (DataStorage *this,
          vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> *v,
          size_t newSize)

{
  pointer pSVar1;
  const_iterator __last;
  ulong uVar2;
  difference_type __d;
  size_type __n;
  SquareMatrix<double,_3> SStack_68;
  
  pSVar1 = (v->
           super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (v->
       super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = ((long)__last._M_current - (long)pSVar1) / 0x48;
  __n = newSize - uVar2;
  if (__n != 0) {
    if (newSize < uVar2 || __n == 0) {
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      erase(v,pSVar1 + newSize,__last);
      return;
    }
    SquareMatrix<double,_3>::SquareMatrix(&SStack_68);
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    insert(v,__last,__n,(value_type *)&SStack_68);
  }
  return;
}

Assistant:

void DataStorage::internalResize(std::vector<T>& v, std::size_t newSize) {
    std::size_t oldSize = v.size();

    if (oldSize == newSize) {
      return;
    } else if (oldSize < newSize) {
      v.insert(v.end(), newSize - oldSize, T());
    } else {
      typename std::vector<T>::iterator i;
      i = v.begin();
      std::advance(i, newSize);
      v.erase(i, v.end());
    }
  }